

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

void write2file(string *output,double *p_value_dp,double *p_value_poisbinom,int m)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ofstream myfile;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)output,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file",0x13);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"k",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"DP",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"PB",2);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    if (-1 < m) {
      uVar3 = 0;
      do {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>(p_value_dp[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>(p_value_poisbinom[uVar3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        uVar3 = uVar3 + 1;
      } while (m + 1 != uVar3);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void write2file(string output, double* p_value_dp, double* p_value_poisbinom, int m)
{
    ofstream myfile (output);
    if (myfile.is_open()) {
        myfile << "k" << "\t" << "DP" << "\t" << "PB" << endl;
        for(int k=0; k<=m; k++){
            myfile << k << "\t" << p_value_dp[k] << "\t" << p_value_poisbinom[k] << endl;
        }
        myfile.close();
        }
    else cout << "Unable to open file";
}